

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O2

void __thiscall
sai::Document::IterateSubLayerFiles
          (Document *this,function<bool_(sai::VirtualFileEntry_&)> *SubLayerProc)

{
  uint uVar1;
  LayerTableEntry LVar2;
  bool bVar3;
  char SubLayerPath [32];
  optional<sai::VirtualFileEntry> SubLayerTableFile;
  optional<sai::VirtualFileEntry> SubLayerFile;
  
  VirtualFileSystem::GetEntry(&SubLayerTableFile,&this->super_VirtualFileSystem,"subtbl");
  if (SubLayerTableFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged == true) {
    uVar1 = VirtualFileEntry::Read<unsigned_int>((VirtualFileEntry *)&SubLayerTableFile);
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      LVar2 = VirtualFileEntry::Read<sai::LayerTableEntry>((VirtualFileEntry *)&SubLayerTableFile);
      SubLayerPath[0x10] = '\0';
      SubLayerPath[0x11] = '\0';
      SubLayerPath[0x12] = '\0';
      SubLayerPath[0x13] = '\0';
      SubLayerPath[0x14] = '\0';
      SubLayerPath[0x15] = '\0';
      SubLayerPath[0x16] = '\0';
      SubLayerPath[0x17] = '\0';
      SubLayerPath[0x18] = '\0';
      SubLayerPath[0x19] = '\0';
      SubLayerPath[0x1a] = '\0';
      SubLayerPath[0x1b] = '\0';
      SubLayerPath[0x1c] = '\0';
      SubLayerPath[0x1d] = '\0';
      SubLayerPath[0x1e] = '\0';
      SubLayerPath[0x1f] = '\0';
      SubLayerPath[0] = '\0';
      SubLayerPath[1] = '\0';
      SubLayerPath[2] = '\0';
      SubLayerPath[3] = '\0';
      SubLayerPath[4] = '\0';
      SubLayerPath[5] = '\0';
      SubLayerPath[6] = '\0';
      SubLayerPath[7] = '\0';
      SubLayerPath[8] = '\0';
      SubLayerPath[9] = '\0';
      SubLayerPath[10] = '\0';
      SubLayerPath[0xb] = '\0';
      SubLayerPath[0xc] = '\0';
      SubLayerPath[0xd] = '\0';
      SubLayerPath[0xe] = '\0';
      SubLayerPath[0xf] = '\0';
      snprintf(SubLayerPath,0x20,"/sublayers/%08x",(ulong)LVar2 & 0xffffffff);
      VirtualFileSystem::GetEntry(&SubLayerFile,&this->super_VirtualFileSystem,SubLayerPath);
      if (SubLayerFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
          super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
          super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged == true) {
        bVar3 = std::function<bool_(sai::VirtualFileEntry_&)>::operator()
                          (SubLayerProc,(VirtualFileEntry *)&SubLayerFile);
        if (!bVar3) {
          std::_Optional_payload_base<sai::VirtualFileEntry>::_M_reset
                    ((_Optional_payload_base<sai::VirtualFileEntry> *)&SubLayerFile);
          break;
        }
      }
      std::_Optional_payload_base<sai::VirtualFileEntry>::_M_reset
                ((_Optional_payload_base<sai::VirtualFileEntry> *)&SubLayerFile);
    }
  }
  std::_Optional_payload_base<sai::VirtualFileEntry>::_M_reset
            ((_Optional_payload_base<sai::VirtualFileEntry> *)&SubLayerTableFile);
  return;
}

Assistant:

void Document::IterateSubLayerFiles(const std::function<bool(VirtualFileEntry&)>& SubLayerProc)
{
	if( std::optional<VirtualFileEntry> SubLayerTableFile = GetEntry("subtbl"); SubLayerTableFile )
	{
		std::uint32_t SubLayerCount = SubLayerTableFile->Read<std::uint32_t>();
		while( SubLayerCount-- ) // Read each layer entry
		{
			const LayerTableEntry CurSubLayerEntry = SubLayerTableFile->Read<LayerTableEntry>();
			char                  SubLayerPath[32] = {};
			std::snprintf(SubLayerPath, 32u, "/sublayers/%08x", CurSubLayerEntry.Identifier);
			if( std::optional<VirtualFileEntry> SubLayerFile = GetEntry(SubLayerPath);
				SubLayerFile )
			{
				if( !SubLayerProc(*SubLayerFile) )
					break;
			}
		}
	}
}